

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitAtomicWait(Replacer *this,AtomicWait *curr)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  Expression *pEVar4;
  Index bytes;
  
  uVar1 = (curr->expectedType).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  bytes = 4;
  iVar3 = (int)uVar1;
  if (iVar3 != 2) {
    if (iVar3 != 3) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                         ,0x170);
    }
    bytes = 8;
  }
  pEVar4 = getPtr<wasm::AtomicWait>(this,curr,bytes);
  curr->ptr = pEVar4;
  pcVar2 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->memory).super_IString.str._M_len = (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->memory).super_IString.str._M_str = pcVar2;
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
      Index bytes;
      switch (curr->expectedType.getBasic()) {
        case Type::i32: {
          bytes = 4;
          break;
        }
        case Type::i64: {
          bytes = 8;
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected type");
      }
      curr->ptr = getPtr(curr, bytes);
      setMemory(curr);
    }